

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageGenerator::GenerateSerializeOneExtensionRange
          (MessageGenerator *this,Printer *printer,ExtensionRange *range)

{
  string local_40;
  ExtensionRange *local_20;
  ExtensionRange *range_local;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  local_20 = range;
  range_local = (ExtensionRange *)printer;
  printer_local = (Printer *)this;
  SimpleItoa_abi_cxx11_(&local_40,(protobuf *)(ulong)(uint)range->end,(int)range);
  io::Printer::Print(printer,"extensionWriter.writeUntil($end$, output);\n","end",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneExtensionRange(
    io::Printer* printer, const Descriptor::ExtensionRange* range) {
  printer->Print(
    "extensionWriter.writeUntil($end$, output);\n",
    "end", SimpleItoa(range->end));
}